

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O2

void draco::parser::SkipWhitespace(DecoderBuffer *buffer)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  bool end_reached;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL) & 0xffffffffffffff;
  while( true ) {
    bVar1 = PeekWhitespace(buffer,(bool *)((long)&uStack_18 + 7));
    if ((!bVar1) || ((uStack_18 & 0x100000000000000) != 0)) break;
    buffer->pos_ = buffer->pos_ + 1;
  }
  return;
}

Assistant:

void SkipWhitespace(DecoderBuffer *buffer) {
  bool end_reached = false;
  while (PeekWhitespace(buffer, &end_reached) && !end_reached) {
    // Skip the whitespace character
    buffer->Advance(1);
  }
}